

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O1

string * __thiscall
enact::AstSerialise::visitStructStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,StructStmt *stmt)

{
  pointer pFVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  Field *field;
  pointer pFVar4;
  stringstream s;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(Stmt::Struct ",0xe);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(stmt->name).lexeme._M_dataplus._M_p,
                      (stmt->name).lexeme._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,") (\n",4);
  std::__cxx11::string::append((char *)&this->m_ident);
  pFVar1 = (stmt->fields).
           super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pFVar4 = (stmt->fields).
                super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar4 != pFVar1; pFVar4 = pFVar4 + 1) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pFVar4->name).lexeme._M_dataplus._M_p,
                        (pFVar4->name).lexeme._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    iVar2 = (*((pFVar4->typename_)._M_t.
               super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
               .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename
              [4])();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)CONCAT44(extraout_var,iVar2),
                        ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitStructStmt(StructStmt &stmt) {
        std::stringstream s;
        s << m_ident << "(Stmt::Struct " << stmt.name.lexeme << " (";

        s << ") (\n";
        m_ident += "    ";

        for (auto &field : stmt.fields) {
            s << m_ident << "(" << field.name.lexeme << " " << field.typename_->name() << ")\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }